

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan_avx2_256_64.c
# Opt level: O2

parasail_result_t *
parasail_nw_stats_scan_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  undefined1 (*pauVar1) [32];
  undefined8 *puVar2;
  __m256i alVar3;
  __m256i alVar4;
  undefined1 auVar5 [32];
  void *pvVar6;
  parasail_matrix_t *ppVar7;
  void *pvVar8;
  void *pvVar9;
  ulong uVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  __m256i alVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  __m256i c;
  __m256i c_00;
  __m256i c_01;
  __m256i c_02;
  __m256i a;
  __m256i a_00;
  __m256i a_01;
  __m256i a_02;
  __m256i a_03;
  __m256i a_04;
  __m256i a_05;
  __m256i a_06;
  __m256i a_07;
  __m256i a_08;
  __m256i a_09;
  __m256i a_10;
  __m256i a_11;
  __m256i b;
  __m256i b_00;
  __m256i b_01;
  __m256i b_02;
  __m256i b_03;
  __m256i b_04;
  __m256i b_05;
  __m256i b_06;
  __m256i b_07;
  __m256i b_08;
  __m256i b_09;
  __m256i b_10;
  __m256i b_11;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [24];
  int iVar23;
  uint uVar24;
  int iVar25;
  parasail_result_t *ppVar26;
  __m256i *b_12;
  __m256i *b_13;
  __m256i *b_14;
  __m256i *b_15;
  __m256i *ptr;
  __m256i *b_16;
  __m256i *b_17;
  __m256i *b_18;
  __m256i *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  __m256i *ptr_04;
  __m256i *ptr_05;
  int64_t *ptr_06;
  long lVar27;
  undefined8 uVar28;
  uint uVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  __m256i *palVar33;
  __m256i *palVar34;
  char *pcVar35;
  int iVar36;
  ulong uVar37;
  __m256i *palVar38;
  int iVar39;
  __m256i *__return_storage_ptr__;
  char *__format;
  long lVar40;
  long lVar41;
  uint uVar42;
  int iVar43;
  ulong uVar44;
  ulong uVar45;
  ulong size;
  bool bVar46;
  undefined1 auVar47 [16];
  undefined1 auVar56 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar62 [16];
  undefined1 auVar59 [32];
  __m256i alVar60;
  undefined1 auVar61 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 in_ZMM6 [64];
  __m256i_64_t h;
  undefined8 in_stack_fffffffffffffa60;
  __m256i *palVar67;
  __m256i *palVar68;
  __m256i *palVar69;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_280 [32];
  ulong local_1a0;
  ulong uStack_198;
  ulong uStack_190;
  ulong uStack_188;
  undefined1 local_180 [32];
  longlong local_80 [10];
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar35 = "profile";
  }
  else {
    pvVar6 = (profile->profile64).score;
    if (pvVar6 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar35 = "profile->profile64.score";
    }
    else {
      ppVar7 = profile->matrix;
      if (ppVar7 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar35 = "profile->matrix";
      }
      else {
        uVar29 = profile->s1Len;
        if ((int)uVar29 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar35 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar35 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar35 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar35 = "open";
        }
        else {
          if (-1 < gap) {
            uVar42 = uVar29 - 1;
            uVar45 = (ulong)uVar29 + 3;
            size = uVar45 >> 2;
            uVar10 = (ulong)uVar42 % size;
            uVar30 = CONCAT44(0,open);
            iVar43 = -open;
            iVar25 = ppVar7->min;
            pvVar8 = (profile->profile64).matches;
            pvVar9 = (profile->profile64).similar;
            uVar37 = 0x8000000000000000 - (long)iVar25;
            if (iVar25 != iVar43 && SBORROW4(iVar25,iVar43) == iVar25 + open < 0) {
              uVar37 = uVar30 | 0x8000000000000000;
            }
            iVar25 = ppVar7->max;
            ppVar26 = parasail_result_new_stats();
            if (ppVar26 != (parasail_result_t *)0x0) {
              ppVar26->flag = ppVar26->flag | 0x4810401;
              b_12 = parasail_memalign___m256i(0x20,size);
              b_13 = parasail_memalign___m256i(0x20,size);
              b_14 = parasail_memalign___m256i(0x20,size);
              b_15 = parasail_memalign___m256i(0x20,size);
              ptr = parasail_memalign___m256i(0x20,size);
              b_16 = parasail_memalign___m256i(0x20,size);
              b_17 = parasail_memalign___m256i(0x20,size);
              b_18 = parasail_memalign___m256i(0x20,size);
              ptr_00 = parasail_memalign___m256i(0x20,size);
              ptr_01 = parasail_memalign___m256i(0x20,size);
              ptr_02 = parasail_memalign___m256i(0x20,size);
              ptr_03 = parasail_memalign___m256i(0x20,size);
              ptr_04 = parasail_memalign___m256i(0x20,size);
              ptr_05 = parasail_memalign___m256i(0x20,size);
              __return_storage_ptr__ = (__m256i *)CONCAT44(0,s2Len + 1);
              local_3c0._0_8_ = __return_storage_ptr__;
              ptr_06 = parasail_memalign_int64_t(0x20,(size_t)__return_storage_ptr__);
              auVar58._8_8_ = 0;
              auVar58._0_8_ = b_12;
              auVar62._8_8_ = 0;
              auVar62._0_8_ = b_13;
              auVar58 = vpunpcklqdq_avx(auVar58,auVar62);
              auVar47._8_8_ = 0;
              auVar47._0_8_ = b_14;
              auVar56._8_8_ = 0;
              auVar56._0_8_ = b_15;
              auVar62 = vpunpcklqdq_avx(auVar47,auVar56);
              auVar47 = ZEXT116(0) * auVar62 + ZEXT116(1) * auVar58;
              auVar56 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar62;
              auVar57._8_8_ = 0;
              auVar57._0_8_ = ptr;
              auVar63._8_8_ = 0;
              auVar63._0_8_ = b_16;
              auVar58 = vpunpcklqdq_avx(auVar57,auVar63);
              auVar64._8_8_ = 0;
              auVar64._0_8_ = b_17;
              auVar65._8_8_ = 0;
              auVar65._0_8_ = b_18;
              auVar62 = vpunpcklqdq_avx(auVar64,auVar65);
              auVar58 = ZEXT116(0) * auVar62 + ZEXT116(1) * auVar58;
              auVar62 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar62;
              auVar66 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
              auVar50._0_8_ = -(ulong)(auVar47._0_8_ == 0);
              auVar50._8_8_ = -(ulong)(auVar47._8_8_ == 0);
              auVar50._16_8_ = -(ulong)(auVar56._0_8_ == 0);
              auVar50._24_8_ = -(ulong)(auVar56._8_8_ == 0);
              auVar59._0_8_ = -(ulong)(auVar58._0_8_ == 0);
              auVar59._8_8_ = -(ulong)(auVar58._8_8_ == 0);
              auVar59._16_8_ = -(ulong)(auVar62._0_8_ == 0);
              auVar59._24_8_ = -(ulong)(auVar62._8_8_ == 0);
              auVar50 = vpackssdw_avx2(auVar50,auVar59);
              if (((((ptr_04 != (__m256i *)0x0 && ptr_03 != (__m256i *)0x0) &&
                    ptr_05 != (__m256i *)0x0) &&
                   ((ptr_01 != (__m256i *)0x0 && ptr_00 != (__m256i *)0x0) &&
                   ptr_02 != (__m256i *)0x0)) && ptr_06 != (int64_t *)0x0) &&
                  ((((((((auVar50 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                        (auVar50 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar50 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      SUB321(auVar50 >> 0x7f,0) == '\0') &&
                     (auVar50 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    SUB321(auVar50 >> 0xbf,0) == '\0') &&
                   (auVar50 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar50[0x1f])) {
                iVar23 = s2Len + -1;
                uVar44 = CONCAT44(0,gap);
                auVar48._8_4_ = gap;
                auVar48._0_8_ = uVar44;
                auVar48._12_4_ = 0;
                auVar48._16_4_ = gap;
                auVar48._20_4_ = 0;
                auVar48._24_4_ = gap;
                auVar48._28_4_ = 0;
                uVar37 = uVar37 + 1;
                lVar31 = 0x7ffffffffffffffe - (long)iVar25;
                auVar49._8_8_ = uVar45;
                auVar49._0_8_ = uVar45;
                auVar49._16_8_ = uVar45;
                auVar49._24_8_ = uVar45;
                auVar50 = vpsrlq_avx2(auVar49,2);
                auVar49 = vpblendd_avx2(auVar50,ZEXT1632((undefined1  [16])0x0),3);
                iVar25 = (int)size;
                lVar27 = (long)-(gap * iVar25);
                auVar51._8_8_ = lVar27;
                auVar51._0_8_ = lVar27;
                auVar51._16_8_ = lVar27;
                auVar51._24_8_ = lVar27;
                auVar50 = vpblendd_avx2(auVar51,ZEXT1632((undefined1  [16])0x0),3);
                auVar50 = vpaddq_avx2(ZEXT832(uVar37),auVar50);
                alVar14[1] = (longlong)b_18;
                alVar14[0] = in_stack_fffffffffffffa60;
                alVar14[2] = (longlong)b_17;
                alVar14[3] = (longlong)ptr;
                parasail_memset___m256i(b_16,alVar14,size);
                alVar3[1] = (longlong)b_18;
                alVar3[0] = in_stack_fffffffffffffa60;
                alVar3[2] = (longlong)b_17;
                alVar3[3] = (longlong)ptr;
                parasail_memset___m256i(b_17,alVar3,size);
                alVar4[1] = (longlong)b_18;
                alVar4[0] = in_stack_fffffffffffffa60;
                alVar4[2] = (longlong)b_17;
                alVar4[3] = (longlong)ptr;
                parasail_memset___m256i(b_18,alVar4,size);
                c[1] = (longlong)b_18;
                c[0] = in_stack_fffffffffffffa60;
                c[2] = (longlong)b_17;
                c[3] = (longlong)ptr;
                parasail_memset___m256i(b_12,c,size);
                c_00[1] = (longlong)b_18;
                c_00[0] = in_stack_fffffffffffffa60;
                c_00[2] = (longlong)b_17;
                c_00[3] = (longlong)ptr;
                parasail_memset___m256i(b_13,c_00,size);
                c_01[1] = (longlong)b_18;
                c_01[0] = in_stack_fffffffffffffa60;
                c_01[2] = (longlong)b_17;
                c_01[3] = (longlong)ptr;
                parasail_memset___m256i(b_14,c_01,size);
                c_02[1] = (longlong)b_18;
                c_02[0] = in_stack_fffffffffffffa60;
                c_02[2] = (longlong)b_17;
                c_02[3] = (longlong)ptr;
                parasail_memset___m256i(b_15,c_02,size);
                auVar53._8_4_ = open;
                auVar53._0_8_ = uVar30;
                auVar53._12_4_ = 0;
                auVar53._16_4_ = open;
                auVar53._20_4_ = 0;
                auVar53._24_4_ = open;
                auVar53._28_4_ = 0;
                alVar14 = (__m256i)vpsubq_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar53);
                uVar24 = iVar25 - 1;
                alVar60[1] = 1;
                alVar60[0] = 1;
                alVar60[2] = 1;
                alVar60[3] = 1;
                auVar59 = vpcmpeqd_avx2(auVar66,auVar66);
                for (uVar29 = uVar24; -1 < (int)uVar29; uVar29 = uVar29 - 1) {
                  ptr_04[uVar29] = alVar14;
                  ptr_05[uVar29] = alVar60;
                  alVar14 = (__m256i)vpsubq_avx2((undefined1  [32])alVar14,auVar48);
                  alVar60 = (__m256i)vpsubq_avx2((undefined1  [32])alVar60,auVar59);
                }
                lVar32 = (long)iVar43;
                lVar27 = lVar32;
                for (uVar45 = 0; uVar45 != size; uVar45 = uVar45 + 1) {
                  lVar40 = lVar27;
                  for (lVar41 = 0; lVar41 != 4; lVar41 = lVar41 + 1) {
                    local_80[lVar41] = lVar40;
                    lVar40 = lVar40 - size * uVar44;
                  }
                  palVar38 = ptr + uVar45;
                  (*palVar38)[0] = local_80[0];
                  (*palVar38)[1] = local_80[1];
                  (*palVar38)[2] = local_80[2];
                  (*palVar38)[3] = local_80[3];
                  lVar27 = lVar27 - uVar44;
                }
                *ptr_06 = 0;
                for (palVar38 = (__m256i *)0x1; __return_storage_ptr__ != palVar38;
                    palVar38 = (__m256i *)((long)*palVar38 + 1)) {
                  ptr_06[(long)palVar38] = lVar32;
                  lVar32 = lVar32 - uVar44;
                }
                palVar38 = ptr + uVar24;
                palVar33 = b_17 + uVar24;
                palVar34 = b_18 + uVar24;
                uVar45 = 0;
                local_180._8_8_ = lVar31;
                local_180._0_8_ = lVar31;
                local_180._16_8_ = lVar31;
                local_180._24_8_ = lVar31;
                local_1a0 = uVar37;
                uStack_198 = uVar37;
                uStack_190 = uVar37;
                uStack_188 = uVar37;
                while (uVar45 != (uint)s2Len) {
                  alVar14 = *palVar38;
                  alVar60 = b_16[uVar24];
                  alVar3 = *palVar33;
                  alVar4 = *palVar34;
                  auVar58 = alVar14._0_16_;
                  auVar66._0_16_ = ZEXT116(0) * auVar58 + ZEXT116(1) * auVar58;
                  auVar66._16_16_ = ZEXT116(0) * alVar14._16_16_ + ZEXT116(1) * auVar58;
                  auVar59 = vpalignr_avx2((undefined1  [32])alVar14,auVar66,8);
                  auVar66 = vperm2i128_avx2((undefined1  [32])alVar60,(undefined1  [32])alVar60,8);
                  auVar66 = vpalignr_avx2((undefined1  [32])alVar60,auVar66,8);
                  auVar53 = vperm2i128_avx2((undefined1  [32])alVar3,(undefined1  [32])alVar3,8);
                  auVar53 = vpalignr_avx2((undefined1  [32])alVar3,auVar53,8);
                  auVar51 = vperm2i128_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar4,8);
                  auVar51 = vpalignr_avx2((undefined1  [32])alVar4,auVar51,8);
                  auVar16 = vpblendd_avx2(auVar59,ZEXT832((ulong)ptr_06[uVar45]),3);
                  lVar27 = (long)(ppVar7->mapper[(byte)s2[uVar45]] * iVar25) * 0x20;
                  local_400._8_8_ = uVar37;
                  local_400._0_8_ = uVar37;
                  local_400._16_8_ = uVar37;
                  local_400._24_8_ = uVar37;
                  auVar59 = vpsubq_avx2(local_400,(undefined1  [32])*ptr_04);
                  auVar55 = ZEXT3264(auVar59);
                  local_4a0 = ZEXT1632(ZEXT816(0));
                  lVar32 = 0;
                  local_520 = ZEXT1632(ZEXT816(0));
                  local_3e0 = ZEXT1632(ZEXT816(0));
                  while( true ) {
                    auVar59 = in_ZMM6._0_32_;
                    if (size << 5 == lVar32) break;
                    auVar5 = *(undefined1 (*) [32])((long)*ptr + lVar32);
                    auVar61 = *(undefined1 (*) [32])((long)*b_16 + lVar32);
                    auVar17 = *(undefined1 (*) [32])((long)*b_17 + lVar32);
                    auVar18 = *(undefined1 (*) [32])((long)*b_18 + lVar32);
                    auVar19 = *(undefined1 (*) [32])((long)*b_13 + lVar32);
                    auVar20 = *(undefined1 (*) [32])((long)*b_14 + lVar32);
                    auVar21 = *(undefined1 (*) [32])((long)*b_15 + lVar32);
                    auVar15._8_4_ = open;
                    auVar15._0_8_ = uVar30;
                    auVar15._12_4_ = 0;
                    auVar15._16_4_ = open;
                    auVar15._20_4_ = 0;
                    auVar15._24_4_ = open;
                    auVar15._28_4_ = 0;
                    auVar54 = vpsubq_avx2(auVar5,auVar15);
                    auVar15 = vpsubq_avx2(*(undefined1 (*) [32])((long)*b_12 + lVar32),auVar48);
                    auVar13 = vpcmpgtq_avx2(auVar54,auVar15);
                    auVar15 = vpaddq_avx2(auVar55._0_32_,
                                          *(undefined1 (*) [32])((long)*ptr_04 + lVar32));
                    auVar52 = vpaddq_avx2(auVar59,*(undefined1 (*) [32])((long)*ptr_05 + lVar32));
                    auVar16 = vpaddq_avx2(auVar16,*(undefined1 (*) [32])
                                                   ((long)pvVar6 + lVar32 + lVar27));
                    auVar11 = vpaddq_avx2(auVar66,*(undefined1 (*) [32])
                                                   ((long)pvVar8 + lVar32 + lVar27));
                    auVar12 = vpaddq_avx2(auVar53,*(undefined1 (*) [32])
                                                   ((long)pvVar9 + lVar32 + lVar27));
                    a[1] = (longlong)b_18;
                    a[0] = in_stack_fffffffffffffa60;
                    a[2] = (longlong)b_17;
                    a[3] = (longlong)ptr;
                    b[1] = (longlong)ptr_04;
                    b[0] = (longlong)ptr_06;
                    b[2] = (longlong)b_15;
                    b[3] = (longlong)b_14;
                    palVar67 = b_15;
                    palVar68 = b_14;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a,b);
                    auVar59 = vblendvpd_avx(auVar19,auVar61,auVar13);
                    auVar66 = vblendvpd_avx(auVar20,auVar17,auVar13);
                    auVar53 = vblendvpd_avx(auVar21,auVar18,auVar13);
                    auVar13 = vpcmpeqd_avx2(auVar13,auVar13);
                    auVar13 = vpsubq_avx2(auVar53,auVar13);
                    auVar53 = vpcmpgtq_avx2(auVar15,local_400);
                    a_00[1] = (longlong)b_18;
                    a_00[0] = in_stack_fffffffffffffa60;
                    a_00[2] = (longlong)b_17;
                    a_00[3] = (longlong)ptr;
                    b_00[1] = (longlong)ptr_04;
                    b_00[0] = (longlong)ptr_06;
                    b_00[2] = (longlong)palVar67;
                    b_00[3] = (longlong)palVar68;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_00,b_00);
                    local_4a0 = vblendvpd_avx(local_4a0,local_3c0,auVar53);
                    local_520 = vblendvpd_avx(local_520,local_280,auVar53);
                    local_3e0 = vblendvpd_avx(local_3e0,auVar52,auVar53);
                    auVar51 = vpsubq_avx2(auVar51,_DAT_008a5a80);
                    auVar55 = ZEXT3264(auVar54);
                    auVar53 = vpcmpgtq_avx2(auVar54,auVar16);
                    a_01[1] = (longlong)b_18;
                    a_01[0] = in_stack_fffffffffffffa60;
                    a_01[2] = (longlong)b_17;
                    a_01[3] = (longlong)ptr;
                    b_01[1] = (longlong)ptr_04;
                    b_01[0] = (longlong)ptr_06;
                    b_01[2] = (longlong)palVar67;
                    b_01[3] = (longlong)palVar68;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_01,b_01);
                    local_3c0 = vblendvpd_avx(auVar11,auVar59,auVar53);
                    local_280 = vblendvpd_avx(auVar12,auVar66,auVar53);
                    auVar53 = vblendvpd_avx(auVar51,auVar13,auVar53);
                    in_ZMM6 = ZEXT3264(auVar53);
                    local_440._0_8_ = auVar54._0_8_;
                    local_440._8_8_ = auVar54._8_8_;
                    local_440._16_8_ = auVar54._16_8_;
                    local_440._24_8_ = auVar54._24_8_;
                    puVar2 = (undefined8 *)((long)*b_12 + lVar32);
                    *puVar2 = local_440._0_8_;
                    puVar2[1] = local_440._8_8_;
                    puVar2[2] = local_440._16_8_;
                    puVar2[3] = local_440._24_8_;
                    *(undefined1 (*) [32])((long)*b_13 + lVar32) = auVar59;
                    *(undefined1 (*) [32])((long)*b_14 + lVar32) = auVar66;
                    *(undefined1 (*) [32])((long)*b_15 + lVar32) = auVar13;
                    local_500._0_8_ = auVar16._0_8_;
                    local_500._8_8_ = auVar16._8_8_;
                    local_500._16_8_ = auVar16._16_8_;
                    local_500._24_8_ = auVar16._24_8_;
                    puVar2 = (undefined8 *)((long)*ptr + lVar32);
                    *puVar2 = local_500._0_8_;
                    puVar2[1] = local_500._8_8_;
                    puVar2[2] = local_500._16_8_;
                    puVar2[3] = local_500._24_8_;
                    *(undefined1 (*) [32])((long)*b_16 + lVar32) = auVar11;
                    *(undefined1 (*) [32])((long)*b_17 + lVar32) = auVar12;
                    *(undefined1 (*) [32])((long)*b_18 + lVar32) = auVar51;
                    lVar32 = lVar32 + 0x20;
                    auVar66 = auVar61;
                    auVar53 = auVar17;
                    auVar16 = auVar5;
                    auVar51 = auVar18;
                    b_15 = palVar67;
                    b_14 = palVar68;
                  }
                  auVar53 = vpermq_avx2(auVar55._0_32_,0x90);
                  auVar66 = vperm2i128_avx2(local_3c0,local_3c0,8);
                  local_3c0 = vpalignr_avx2(local_3c0,auVar66,8);
                  auVar66 = vperm2i128_avx2(local_280,local_280,8);
                  local_280 = vpalignr_avx2(local_280,auVar66,8);
                  auVar66 = vperm2i128_avx2(auVar59,auVar59,8);
                  auVar51 = vpalignr_avx2(auVar59,auVar66,8);
                  auVar5 = vpblendd_avx2(auVar53,ZEXT832((ulong)ptr_06[uVar45 + 1]),3);
                  auVar59 = vpaddq_avx2(auVar5,(undefined1  [32])*ptr_04);
                  uVar45 = uVar45 + 1;
                  auVar55 = ZEXT3264(local_400);
                  auVar16 = vpcmpgtq_avx2(local_400,auVar59);
                  auVar66 = vpaddq_avx2(auVar51,(undefined1  [32])*ptr_05);
                  a_02[1] = (longlong)b_18;
                  a_02[0] = in_stack_fffffffffffffa60;
                  a_02[2] = (longlong)b_17;
                  a_02[3] = (longlong)ptr;
                  b_02[1] = (longlong)ptr_04;
                  b_02[0] = (longlong)ptr_06;
                  b_02[2] = (longlong)b_15;
                  b_02[3] = (longlong)b_14;
                  _mm256_max_epi64_rpl(__return_storage_ptr__,a_02,b_02);
                  auVar59 = vblendvpd_avx(local_3c0,local_4a0,auVar16);
                  auVar53 = vblendvpd_avx(local_280,local_520,auVar16);
                  auVar66 = vblendvpd_avx(auVar66,local_3e0,auVar16);
                  iVar43 = 2;
                  while( true ) {
                    auVar52 = auVar55._0_32_;
                    auVar16 = vperm2i128_avx2(auVar52,auVar52,8);
                    auVar15 = vpalignr_avx2(auVar52,auVar16,8);
                    auVar16 = vperm2f128_avx(auVar59,auVar59,8);
                    local_4c0 = vpalignr_avx2(auVar59,auVar16,8);
                    auVar16 = vperm2f128_avx(auVar53,auVar53,8);
                    local_4e0 = vpalignr_avx2(auVar53,auVar16,8);
                    auVar16 = vperm2f128_avx(auVar66,auVar66,8);
                    local_420 = vpalignr_avx2(auVar66,auVar16,8);
                    bVar46 = iVar43 == 0;
                    iVar43 = iVar43 + -1;
                    if (bVar46) break;
                    auVar16 = vpaddq_avx2(auVar15,auVar50);
                    auVar15 = vpcmpgtq_avx2(auVar52,auVar16);
                    a_03[1] = (longlong)b_18;
                    a_03[0] = in_stack_fffffffffffffa60;
                    a_03[2] = (longlong)b_17;
                    a_03[3] = (longlong)ptr;
                    b_03[1] = (longlong)ptr_04;
                    b_03[0] = (longlong)ptr_06;
                    b_03[2] = (longlong)b_15;
                    b_03[3] = (longlong)b_14;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_03,b_03);
                    auVar59 = vblendvpd_avx(local_4c0,auVar59,auVar15);
                    auVar53 = vblendvpd_avx(local_4e0,auVar53,auVar15);
                    auVar16 = vpaddq_avx2(local_420,auVar49);
                    auVar66 = vblendvpd_avx(auVar16,auVar66,auVar15);
                  }
                  local_500 = vpaddq_avx2(auVar15,ZEXT832(uVar37));
                  auVar59 = vpcmpgtq_avx2(local_500,auVar5);
                  a_04[1] = (longlong)b_18;
                  a_04[0] = in_stack_fffffffffffffa60;
                  a_04[2] = (longlong)b_17;
                  a_04[3] = (longlong)ptr;
                  b_04[1] = (longlong)ptr_04;
                  b_04[0] = (longlong)ptr_06;
                  b_04[2] = (longlong)b_15;
                  b_04[3] = (longlong)b_14;
                  local_400 = local_500;
                  _mm256_max_epi64_rpl(__return_storage_ptr__,a_04,b_04);
                  local_440 = vblendvpd_avx(local_3c0,local_4c0,auVar59);
                  local_4a0 = vblendvpd_avx(local_280,local_4e0,auVar59);
                  local_520 = vblendvpd_avx(auVar51,local_420,auVar59);
                  for (lVar27 = 0; in_ZMM6 = ZEXT3264(auVar51), size << 5 != lVar27;
                      lVar27 = lVar27 + 0x20) {
                    pauVar1 = (undefined1 (*) [32])((long)*ptr + lVar27);
                    auVar22 = *(undefined1 (*) [24])*pauVar1;
                    lVar32 = *(long *)(*pauVar1 + 0x18);
                    auVar53 = *pauVar1;
                    auVar5 = *(undefined1 (*) [32])((long)*b_16 + lVar27);
                    auVar15 = *(undefined1 (*) [32])((long)*b_17 + lVar27);
                    auVar52 = *(undefined1 (*) [32])((long)*b_18 + lVar27);
                    auVar11 = *(undefined1 (*) [32])((long)*b_13 + lVar27);
                    auVar12 = *(undefined1 (*) [32])((long)*b_14 + lVar27);
                    auVar13 = *(undefined1 (*) [32])((long)*b_15 + lVar27);
                    auVar16._8_4_ = open;
                    auVar16._0_8_ = uVar30;
                    auVar16._12_4_ = 0;
                    auVar16._16_4_ = open;
                    auVar16._20_4_ = 0;
                    auVar16._24_4_ = open;
                    auVar16._28_4_ = 0;
                    auVar59 = vpsubq_avx2(local_400,auVar16);
                    auVar66 = vpsubq_avx2(local_500,auVar48);
                    a_05[1] = (longlong)b_18;
                    a_05[0] = in_stack_fffffffffffffa60;
                    a_05[2] = (longlong)b_17;
                    a_05[3] = (longlong)ptr;
                    b_05[1] = (longlong)ptr_04;
                    b_05[0] = (longlong)ptr_06;
                    b_05[2] = (longlong)b_15;
                    b_05[3] = (longlong)b_14;
                    local_500 = auVar59;
                    palVar67 = b_18;
                    palVar68 = b_17;
                    palVar69 = ptr;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_05,b_05);
                    auVar59 = vpcmpgtq_avx2(auVar59,auVar66);
                    local_4c0 = vblendvpd_avx(local_4c0,local_440,auVar59);
                    local_4e0 = vblendvpd_avx(local_4e0,local_4a0,auVar59);
                    auVar59 = vblendvpd_avx(local_420,local_520,auVar59);
                    local_420 = vpsubq_avx2(auVar59,_DAT_008a5a80);
                    a_06[1] = (longlong)palVar67;
                    a_06[0] = in_stack_fffffffffffffa60;
                    a_06[2] = (longlong)palVar68;
                    a_06[3] = (longlong)palVar69;
                    b_06[1] = (longlong)ptr_04;
                    b_06[0] = (longlong)ptr_06;
                    b_06[2] = (longlong)b_15;
                    b_06[3] = (longlong)b_14;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_06,b_06);
                    a_07[1] = (longlong)palVar67;
                    a_07[0] = in_stack_fffffffffffffa60;
                    a_07[2] = (longlong)palVar68;
                    a_07[3] = (longlong)palVar69;
                    b_07[1] = (longlong)ptr_04;
                    b_07[0] = (longlong)ptr_06;
                    b_07[2] = (longlong)b_15;
                    b_07[3] = (longlong)b_14;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_07,b_07);
                    local_3e0._0_8_ = auVar22._0_8_;
                    auVar54._0_8_ = -(ulong)(auVar53._0_8_ == local_3e0._0_8_);
                    local_3e0._8_8_ = auVar22._8_8_;
                    auVar54._8_8_ = -(ulong)(auVar53._8_8_ == local_3e0._8_8_);
                    auVar54._16_8_ = -(ulong)(auVar53._16_8_ == auVar22._16_8_);
                    auVar54._24_8_ = -(ulong)(auVar53._24_8_ == lVar32);
                    auVar61._0_8_ = -(ulong)(auVar53._0_8_ == local_500._0_8_);
                    auVar61._8_8_ = -(ulong)(auVar53._8_8_ == local_500._8_8_);
                    auVar61._16_8_ = -(ulong)(auVar53._16_8_ == local_500._16_8_);
                    auVar61._24_8_ = -(ulong)(auVar53._24_8_ == local_500._24_8_);
                    auVar59 = vblendvpd_avx(auVar11,local_4c0,auVar61);
                    local_440 = vblendvpd_avx(auVar59,auVar5,auVar54);
                    auVar59 = vblendvpd_avx(auVar12,local_4e0,auVar61);
                    local_4a0 = vblendvpd_avx(auVar59,auVar15,auVar54);
                    auVar59 = vblendvpd_avx(auVar13,local_420,auVar61);
                    local_520 = vblendvpd_avx(auVar59,auVar52,auVar54);
                    *(undefined1 (*) [32])((long)*ptr + lVar27) = auVar53;
                    *(undefined1 (*) [32])((long)*b_16 + lVar27) = local_440;
                    *(undefined1 (*) [32])((long)*b_17 + lVar27) = local_4a0;
                    *(undefined1 (*) [32])((long)*b_18 + lVar27) = local_520;
                    auVar59 = vpcmpgtq_avx2(auVar53,local_180);
                    local_180 = vblendvpd_avx(auVar53,local_180,auVar59);
                    a_08[1] = (longlong)palVar67;
                    a_08[0] = in_stack_fffffffffffffa60;
                    a_08[2] = (longlong)palVar68;
                    a_08[3] = (longlong)palVar69;
                    b_08[1] = (longlong)ptr_04;
                    b_08[0] = (longlong)ptr_06;
                    b_08[2] = (longlong)b_15;
                    b_08[3] = (longlong)b_14;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_08,b_08);
                    a_09[1] = (longlong)palVar67;
                    a_09[0] = in_stack_fffffffffffffa60;
                    a_09[2] = (longlong)palVar68;
                    a_09[3] = (longlong)palVar69;
                    b_09[1] = (longlong)ptr_04;
                    b_09[0] = (longlong)ptr_06;
                    b_09[2] = (longlong)b_15;
                    b_09[3] = (longlong)b_14;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_09,b_09);
                    a_10[1] = (longlong)palVar67;
                    a_10[0] = in_stack_fffffffffffffa60;
                    a_10[2] = (longlong)palVar68;
                    a_10[3] = (longlong)palVar69;
                    b_10[1] = (longlong)ptr_04;
                    b_10[0] = (longlong)ptr_06;
                    b_10[2] = (longlong)b_15;
                    b_10[3] = (longlong)b_14;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_10,b_10);
                    a_11[1] = (longlong)palVar67;
                    a_11[0] = in_stack_fffffffffffffa60;
                    a_11[2] = (longlong)palVar68;
                    a_11[3] = (longlong)palVar69;
                    b_11[1] = (longlong)ptr_04;
                    b_11[0] = (longlong)ptr_06;
                    b_11[2] = (longlong)b_15;
                    b_11[3] = (longlong)b_14;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_11,b_11);
                    b_18 = palVar67;
                    b_17 = palVar68;
                    ptr = palVar69;
                    local_400 = auVar53;
                  }
                }
                alVar14 = ptr[uVar10];
                alVar60 = b_16[uVar10];
                alVar3 = b_17[uVar10];
                alVar4 = b_18[uVar10];
                for (iVar25 = 0; iVar25 < 3 - (int)(uVar42 / size); iVar25 = iVar25 + 1) {
                  auVar50 = vperm2i128_avx2((undefined1  [32])alVar14,(undefined1  [32])alVar14,8);
                  alVar14 = (__m256i)vpalignr_avx2((undefined1  [32])alVar14,auVar50,8);
                  auVar50 = vperm2i128_avx2((undefined1  [32])alVar60,(undefined1  [32])alVar60,8);
                  alVar60 = (__m256i)vpalignr_avx2((undefined1  [32])alVar60,auVar50,8);
                  auVar50 = vperm2i128_avx2((undefined1  [32])alVar3,(undefined1  [32])alVar3,8);
                  alVar3 = (__m256i)vpalignr_avx2((undefined1  [32])alVar3,auVar50,8);
                  auVar50 = vperm2i128_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar4,8);
                  alVar4 = (__m256i)vpalignr_avx2((undefined1  [32])alVar4,auVar50,8);
                }
                auVar5._8_8_ = uVar37;
                auVar5._0_8_ = uVar37;
                auVar5._16_8_ = uVar37;
                auVar5._24_8_ = uVar37;
                auVar50 = vpcmpgtq_avx2(auVar5,local_180);
                auVar52._8_8_ = uStack_198;
                auVar52._0_8_ = local_1a0;
                auVar52._16_8_ = uStack_190;
                auVar52._24_8_ = uStack_188;
                auVar11._8_8_ = lVar31;
                auVar11._0_8_ = lVar31;
                auVar11._16_8_ = lVar31;
                auVar11._24_8_ = lVar31;
                auVar59 = vpcmpgtq_avx2(auVar52,auVar11);
                auVar50 = vpor_avx2(auVar59,auVar50);
                if ((((auVar50 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     SUB321(auVar50 >> 0x7f,0) == '\0') && SUB321(auVar50 >> 0xbf,0) == '\0') &&
                    -1 < auVar50[0x1f]) {
                  uVar28 = vpextrq_avx(alVar14._16_16_,1);
                  iVar25 = (int)uVar28;
                  uVar28 = vpextrq_avx(alVar60._16_16_,1);
                  iVar43 = (int)uVar28;
                  uVar28 = vpextrq_avx(alVar3._16_16_,1);
                  iVar36 = (int)uVar28;
                  uVar28 = vpextrq_avx(alVar4._16_16_,1);
                  iVar39 = (int)uVar28;
                }
                else {
                  *(byte *)&ppVar26->flag = (byte)ppVar26->flag | 0x40;
                  iVar25 = 0;
                  iVar43 = 0;
                  iVar36 = 0;
                  iVar39 = 0;
                  iVar23 = 0;
                  uVar42 = 0;
                }
                ppVar26->score = iVar25;
                ppVar26->end_query = uVar42;
                ppVar26->end_ref = iVar23;
                ((ppVar26->field_4).stats)->matches = iVar43;
                ((ppVar26->field_4).stats)->similar = iVar36;
                ((ppVar26->field_4).stats)->length = iVar39;
                parasail_free(ptr_06);
                parasail_free(ptr_05);
                parasail_free(ptr_04);
                parasail_free(ptr_03);
                parasail_free(ptr_02);
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(b_18);
                parasail_free(b_17);
                parasail_free(b_16);
                parasail_free(ptr);
                parasail_free(b_15);
                parasail_free(b_14);
                parasail_free(b_13);
                parasail_free(b_12);
                return ppVar26;
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar35 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_stats_scan_profile_avx2_256_64",pcVar35);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvPm = NULL;
    __m256i* restrict pvPs = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvHM = NULL;
    __m256i* restrict pvHS = NULL;
    __m256i* restrict pvHL = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvHMMax = NULL;
    __m256i* restrict pvHSMax = NULL;
    __m256i* restrict pvHLMax = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i* restrict pvGapperL = NULL;
    int64_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m256i vZero;
    __m256i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    __m256i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m256i*)profile->profile64.score;
    pvPm = (__m256i*)profile->profile64.matches;
    pvPs = (__m256i*)profile->profile64.similar;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi64x_rpl(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vSegLen = _mm256_slli_si256_rpl(_mm256_set1_epi64x_rpl(segLen), 8);
    vNegInfFront = _mm256_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_add_epi64(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m256i(32, segLen);
    pvEM = parasail_memalign___m256i(32, segLen);
    pvES = parasail_memalign___m256i(32, segLen);
    pvEL = parasail_memalign___m256i(32, segLen);
    pvH  = parasail_memalign___m256i(32, segLen);
    pvHM = parasail_memalign___m256i(32, segLen);
    pvHS = parasail_memalign___m256i(32, segLen);
    pvHL = parasail_memalign___m256i(32, segLen);
    pvHMax  = parasail_memalign___m256i(32, segLen);
    pvHMMax = parasail_memalign___m256i(32, segLen);
    pvHSMax = parasail_memalign___m256i(32, segLen);
    pvHLMax = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);
    pvGapperL = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int64_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m256i(pvHM, vZero, segLen);
    parasail_memset___m256i(pvHS, vZero, segLen);
    parasail_memset___m256i(pvHL, vZero, segLen);
    parasail_memset___m256i(pvE, vNegLimit, segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vZero, segLen);
    {
        __m256i vGapper = _mm256_sub_epi64(vZero,vGapO);
        __m256i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            _mm256_store_si256(pvGapperL+i, vGapperL);
            vGapper = _mm256_sub_epi64(vGapper, vGapE);
            vGapperL = _mm256_add_epi64(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vE_ext;
        __m256i vE_opn;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vHt;
        __m256i vHtM;
        __m256i vHtS;
        __m256i vHtL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vF_opn;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        __m256i vHp;
        __m256i vHpM;
        __m256i vHpS;
        __m256i vHpL;
        __m256i *pvW;
        __m256i vW;
        __m256i *pvWM;
        __m256i vWM;
        __m256i *pvWS;
        __m256i vWS;
        __m256i case1;
        __m256i case2;
        __m256i vGapper;
        __m256i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHpM = _mm256_load_si256(pvHM+(segLen-1));
        vHpS = _mm256_load_si256(pvHS+(segLen-1));
        vHpL = _mm256_load_si256(pvHL+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 8);
        vHpM = _mm256_slli_si256_rpl(vHpM, 8);
        vHpS = _mm256_slli_si256_rpl(vHpS, 8);
        vHpL = _mm256_slli_si256_rpl(vHpL, 8);
        vHp = _mm256_insert_epi64_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_sub_epi64(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vHM= _mm256_load_si256(pvHM+i);
            vHS= _mm256_load_si256(pvHS+i);
            vHL= _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM= _mm256_load_si256(pvEM+i);
            vES= _mm256_load_si256(pvES+i);
            vEL= _mm256_load_si256(pvEL+i);
            vW = _mm256_load_si256(pvW+i);
            vWM = _mm256_load_si256(pvWM+i);
            vWS = _mm256_load_si256(pvWS+i);
            vGapper = _mm256_load_si256(pvGapper+i);
            vGapperL = _mm256_load_si256(pvGapperL+i);
            vE_opn = _mm256_sub_epi64(vH, vGapO);
            vE_ext = _mm256_sub_epi64(vE, vGapE);
            case1 = _mm256_cmpgt_epi64(vE_opn, vE_ext);
            vE = _mm256_max_epi64_rpl(vE_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(vEL, vHL, case1);
            vEL = _mm256_add_epi64(vEL, vOne);
            vGapper = _mm256_add_epi64(vHt, vGapper);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi64(vF, vGapper),
                    _mm256_cmpeq_epi64(vF, vGapper));
            vF = _mm256_max_epi64_rpl(vF, vGapper);
            vFM = _mm256_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm256_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_add_epi64(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm256_add_epi64(vHp, vW);
            vHpM = _mm256_add_epi64(vHpM, vWM);
            vHpS = _mm256_add_epi64(vHpS, vWS);
            vHpL = _mm256_add_epi64(vHpL, vOne);
            case1 = _mm256_cmpgt_epi64(vE, vHp);
            vHt = _mm256_max_epi64_rpl(vE, vHp);
            vHtM = _mm256_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm256_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm256_blendv_epi8(vHpL, vEL, case1);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvEM+i, vEM);
            _mm256_store_si256(pvES+i, vES);
            _mm256_store_si256(pvEL+i, vEL);
            _mm256_store_si256(pvH+i, vHp);
            _mm256_store_si256(pvHM+i, vHpM);
            _mm256_store_si256(pvHS+i, vHpS);
            _mm256_store_si256(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 8);
        vHtM = _mm256_slli_si256_rpl(vHtM, 8);
        vHtS = _mm256_slli_si256_rpl(vHtS, 8);
        vHtL = _mm256_slli_si256_rpl(vHtL, 8);
        vHt = _mm256_insert_epi64_rpl(vHt, boundary[j+1], 0);
        vGapper = _mm256_load_si256(pvGapper);
        vGapperL = _mm256_load_si256(pvGapperL);
        vGapper = _mm256_add_epi64(vHt, vGapper);
        case1 = _mm256_or_si256(
                _mm256_cmpgt_epi64(vGapper, vF),
                _mm256_cmpeq_epi64(vGapper, vF));
        vF = _mm256_max_epi64_rpl(vF, vGapper);
        vFM = _mm256_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm256_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm256_blendv_epi8(
                vFL,
                _mm256_add_epi64(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 8);
            __m256i vFtM = _mm256_slli_si256_rpl(vFM, 8);
            __m256i vFtS = _mm256_slli_si256_rpl(vFS, 8);
            __m256i vFtL = _mm256_slli_si256_rpl(vFL, 8);
            vFt = _mm256_add_epi64(vFt, vSegLenXgap);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi64(vFt, vF),
                    _mm256_cmpeq_epi64(vFt, vF));
            vF = _mm256_max_epi64_rpl(vF, vFt);
            vFM = _mm256_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm256_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm256_blendv_epi8(
                    vFL,
                    _mm256_add_epi64(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 8);
        vFM = _mm256_slli_si256_rpl(vFM, 8);
        vFS = _mm256_slli_si256_rpl(vFS, 8);
        vFL = _mm256_slli_si256_rpl(vFL, 8);
        vF = _mm256_add_epi64(vF, vNegInfFront);
        case1 = _mm256_cmpgt_epi64(vF, vHt);
        vH = _mm256_max_epi64_rpl(vF, vHt);
        vHM = _mm256_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm256_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm256_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm256_load_si256(pvH+i);
            vHpM = _mm256_load_si256(pvHM+i);
            vHpS = _mm256_load_si256(pvHS+i);
            vHpL = _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM = _mm256_load_si256(pvEM+i);
            vES = _mm256_load_si256(pvES+i);
            vEL = _mm256_load_si256(pvEL+i);
            vF_opn = _mm256_sub_epi64(vH, vGapO);
            vF_ext = _mm256_sub_epi64(vF, vGapE);
            vF = _mm256_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi64(vF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(vFL, vHL, case1);
            vFL = _mm256_add_epi64(vFL, vOne);
            vH = _mm256_max_epi64_rpl(vHp, vE);
            vH = _mm256_max_epi64_rpl(vH, vF);
            case1 = _mm256_cmpeq_epi64(vH, vHp);
            case2 = _mm256_cmpeq_epi64(vH, vF);
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm256_store_si256(pvH+i, vH);
            _mm256_store_si256(pvHM+i, vHM);
            _mm256_store_si256(pvHS+i, vHS);
            _mm256_store_si256(pvHL+i, vHL);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvH + offset);
            vHM = _mm256_load_si256(pvHM + offset);
            vHS = _mm256_load_si256(pvHS + offset);
            vHL = _mm256_load_si256(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
                vHM = _mm256_slli_si256_rpl(vHM, 8);
                vHS = _mm256_slli_si256_rpl(vHS, 8);
                vHL = _mm256_slli_si256_rpl(vHL, 8);
            }
            result->stats->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
            result->stats->rowcols->matches_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHM, 3);
            result->stats->rowcols->similar_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHS, 3);
            result->stats->rowcols->length_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHL, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        __m256i vHM = _mm256_load_si256(pvHM+i);
        __m256i vHS = _mm256_load_si256(pvHS+i);
        __m256i vHL = _mm256_load_si256(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvH + offset);
        __m256i vHM = _mm256_load_si256(pvHM + offset);
        __m256i vHS = _mm256_load_si256(pvHS + offset);
        __m256i vHL = _mm256_load_si256(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 8);
            vHM = _mm256_slli_si256_rpl(vHM, 8);
            vHS = _mm256_slli_si256_rpl(vHS, 8);
            vHL = _mm256_slli_si256_rpl(vHL, 8);
        }
        score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        matches = (int64_t) _mm256_extract_epi64_rpl (vHM, 3);
        similar = (int64_t) _mm256_extract_epi64_rpl (vHS, 3);
        length = (int64_t) _mm256_extract_epi64_rpl (vHL, 3);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}